

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O2

uint8_t mpeg_bitstream_packet_type(mpeg_bitstream_t *packet,uint stream_type)

{
  if (3 < packet->size) {
    if (stream_type == 0x24) {
      return packet->data[3] >> 1 & 0x3f;
    }
    if (stream_type == 0x1b) {
      return packet->data[3] & 0x1f;
    }
    if (stream_type == 2) {
      return packet->data[3];
    }
  }
  return '\0';
}

Assistant:

uint8_t mpeg_bitstream_packet_type(mpeg_bitstream_t* packet, unsigned stream_type)
{
    if (4 > packet->size) {
        return 0;
    }
    switch (stream_type) {
    case STREAM_TYPE_H262:
        return packet->data[3];
    case STREAM_TYPE_H264:
        return packet->data[3] & 0x1F;
    case STREAM_TYPE_H265:
        return (packet->data[3] >> 1) & 0x3F;
    default:
        return 0;
    }
}